

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

bool __thiscall cmMakefile::ReadListFile(cmMakefile *this,char *filename)

{
  bool bVar1;
  bool bVar2;
  char *in_base;
  cmListFile listFile;
  ListFileScope scope;
  string filenametoread;
  cmParseFileScope pfs;
  cmListFile local_88;
  ListFileScope local_70;
  string local_60;
  cmParseFileScope local_40;
  
  std::__cxx11::string::string((string *)&local_40,filename,(allocator *)&local_88);
  in_base = GetCurrentSourceDirectory(this);
  cmsys::SystemTools::CollapseFullPath(&local_60,(string *)&local_40,in_base);
  std::__cxx11::string::~string((string *)&local_40);
  ListFileScope::ListFileScope(&local_70,this,&local_60);
  local_88.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmParseFileScope::cmParseFileScope(&local_40,this);
  bVar1 = cmListFile::ParseFile(&local_88,local_60._M_dataplus._M_p,false,this);
  cmParseFileScope::~cmParseFileScope(&local_40);
  if (bVar1) {
    ReadListFile(this,&local_88,&local_60);
    bVar2 = cmSystemTools::GetFatalErrorOccured();
    if (bVar2) {
      local_70.ReportError = false;
    }
  }
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::~vector(&local_88.Functions)
  ;
  ListFileScope::~ListFileScope(&local_70);
  std::__cxx11::string::~string((string *)&local_60);
  return bVar1;
}

Assistant:

bool cmMakefile::ReadListFile(const char* filename)
{
  std::string filenametoread =
    cmSystemTools::CollapseFullPath(filename,
                                    this->GetCurrentSourceDirectory());

  ListFileScope scope(this, filenametoread);

  cmListFile listFile;
  {
  cmParseFileScope pfs(this);
  if (!listFile.ParseFile(filenametoread.c_str(), false, this))
    {
    return false;
    }
  }

  this->ReadListFile(listFile, filenametoread);
  if(cmSystemTools::GetFatalErrorOccured())
    {
    scope.Quiet();
    }
  return true;
}